

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall
Json::OurCharReader::parse(OurCharReader *this,char *beginDoc,char *endDoc,Value *root,string *errs)

{
  bool bVar1;
  string local_40;
  
  bVar1 = OurReader::parse(&this->reader_,beginDoc,endDoc,root,this->collectComments_);
  if (errs != (string *)0x0) {
    OurReader::getFormattedErrorMessages_abi_cxx11_(&local_40,&this->reader_);
    std::__cxx11::string::operator=((string *)errs,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  return bVar1;
}

Assistant:

virtual bool parse(
      char const* beginDoc, char const* endDoc,
      Value* root, std::string* errs) {
    bool ok = reader_.parse(beginDoc, endDoc, *root, collectComments_);
    if (errs) {
      *errs = reader_.getFormattedErrorMessages();
    }
    return ok;
  }